

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void * register_functions(void *param_1)

{
  allocator<char> local_29;
  string local_28 [32];
  
  std::__cxx11::string::string<std::allocator<char>>(local_28,"resize",&local_29);
  skiwi::register_external_primitive
            (local_28,scm_resize,skiwi_void,skiwi_int64,skiwi_int64,
             "(resize w h) resizes the Game of Life grid to w x h cells.");
  std::__cxx11::string::~string(local_28);
  std::__cxx11::string::string<std::allocator<char>>(local_28,"randomize",&local_29);
  skiwi::register_external_primitive
            (local_28,scm_randomize,skiwi_void,
             "(randomize) fills the Game of Life grid with random cells.");
  std::__cxx11::string::~string(local_28);
  std::__cxx11::string::string<std::allocator<char>>(local_28,"clear",&local_29);
  skiwi::register_external_primitive
            (local_28,scm_clear,skiwi_void,"(clear) clears the Game of Life grid.");
  std::__cxx11::string::~string(local_28);
  std::__cxx11::string::string<std::allocator<char>>(local_28,"next",&local_29);
  skiwi::register_external_primitive
            (local_28,scm_next,skiwi_void,
             "(next) shows the next generation of the Game of Life grid.");
  std::__cxx11::string::~string(local_28);
  std::__cxx11::string::string<std::allocator<char>>(local_28,"run",&local_29);
  skiwi::register_external_primitive
            (local_28,scm_run,skiwi_void,"(run) starts the Game of Life simulation.");
  std::__cxx11::string::~string(local_28);
  std::__cxx11::string::string<std::allocator<char>>(local_28,"stop",&local_29);
  skiwi::register_external_primitive
            (local_28,scm_stop,skiwi_void,"(stop) stops the Game of Life simulation.");
  std::__cxx11::string::~string(local_28);
  std::__cxx11::string::string<std::allocator<char>>(local_28,"game-sleep",&local_29);
  skiwi::register_external_primitive
            (local_28,scm_game_sleep,skiwi_void,skiwi_int64,
             "(game-sleep <number>) waits <number> milliseconds between generations.");
  std::__cxx11::string::~string(local_28);
  std::__cxx11::string::string<std::allocator<char>>(local_28,"set-cell",&local_29);
  skiwi::register_external_primitive
            (local_28,scm_set_cell,skiwi_void,skiwi_int64,skiwi_int64,
             "(set-cell <x> <y>) sets cell (x,y) on");
  std::__cxx11::string::~string(local_28);
  std::__cxx11::string::string<std::allocator<char>>(local_28,"clear-cell",&local_29);
  skiwi::register_external_primitive
            (local_28,scm_clear_cell,skiwi_void,skiwi_int64,skiwi_int64,
             "(clear-cell <x> <y>) sets cell (x,y) off");
  std::__cxx11::string::~string(local_28);
  std::__cxx11::string::string<std::allocator<char>>(local_28,"gun",&local_29);
  skiwi::register_external_primitive
            (local_28,scm_gun,skiwi_void,"(gun) generates the Gosper glider gun");
  std::__cxx11::string::~string(local_28);
  std::__cxx11::string::string<std::allocator<char>>(local_28,"space-rake",&local_29);
  skiwi::register_external_primitive
            (local_28,scm_space_rake,skiwi_void,"(space-rake) generates the space-rake");
  std::__cxx11::string::~string(local_28);
  std::__cxx11::string::string<std::allocator<char>>(local_28,"spaceship",&local_29);
  skiwi::register_external_primitive
            (local_28,scm_spaceship,skiwi_void,"(spaceship) generates the spaceship or glider");
  std::__cxx11::string::~string(local_28);
  return (void *)0x0;
}

Assistant:

void* register_functions(void*)
  {
  using namespace skiwi;
  register_external_primitive("resize", (void*)&scm_resize, skiwi_void, skiwi_int64, skiwi_int64, "(resize w h) resizes the Game of Life grid to w x h cells.");
  register_external_primitive("randomize", (void*)&scm_randomize, skiwi_void, "(randomize) fills the Game of Life grid with random cells.");
  register_external_primitive("clear", (void*)&scm_clear, skiwi_void, "(clear) clears the Game of Life grid.");
  register_external_primitive("next", (void*)&scm_next, skiwi_void, "(next) shows the next generation of the Game of Life grid.");
  register_external_primitive("run", (void*)&scm_run, skiwi_void, "(run) starts the Game of Life simulation.");
  register_external_primitive("stop", (void*)&scm_stop, skiwi_void, "(stop) stops the Game of Life simulation.");
  register_external_primitive("game-sleep", (void*)&scm_game_sleep, skiwi_void, skiwi_int64, "(game-sleep <number>) waits <number> milliseconds between generations.");
  register_external_primitive("set-cell", (void*)&scm_set_cell, skiwi_void, skiwi_int64, skiwi_int64, "(set-cell <x> <y>) sets cell (x,y) on");
  register_external_primitive("clear-cell", (void*)&scm_clear_cell, skiwi_void, skiwi_int64, skiwi_int64, "(clear-cell <x> <y>) sets cell (x,y) off");
  register_external_primitive("gun", (void*)&scm_gun, skiwi_void, "(gun) generates the Gosper glider gun");
  register_external_primitive("space-rake", (void*)&scm_space_rake, skiwi_void, "(space-rake) generates the space-rake");
  register_external_primitive("spaceship", (void*)&scm_spaceship, skiwi_void, "(spaceship) generates the spaceship or glider");
  return nullptr;
  }